

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  U32 lowestValid;
  ulong *iLimit;
  ulong *puVar9;
  ulong *puVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  uint uVar15;
  uint uVar16;
  ulong *puVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ulong *puVar27;
  BYTE *litEnd;
  ulong *puVar28;
  ulong *puVar29;
  BYTE *pBVar30;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  ZSTD_matchState_t *local_b0;
  ulong local_a8;
  uint local_a0;
  uint local_9c;
  seqStore_t *local_98;
  BYTE *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  local_90 = (ms->window).base;
  uVar16 = (ms->window).dictLimit;
  local_40 = local_90 + uVar16;
  uVar12 = (ms->cParams).minMatch;
  if (5 < uVar12) {
    uVar12 = 6;
  }
  if (uVar12 < 5) {
    uVar12 = 4;
  }
  local_9c = (ms->cParams).searchLog;
  local_bc = 6;
  if (local_9c < 6) {
    local_bc = local_9c;
  }
  if (local_bc < 5) {
    local_bc = 4;
  }
  puVar28 = (ulong *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar25 = (int)puVar28 - (int)local_90;
  local_58 = *rep;
  local_54 = iVar25 - uVar23;
  if (iVar25 - uVar16 <= uVar23) {
    local_54 = uVar16;
  }
  uVar23 = 0;
  if (ms->loadedDictEnd != 0) {
    local_54 = uVar16;
  }
  local_5c = rep[1];
  local_54 = iVar25 - local_54;
  local_a0 = local_5c;
  if (local_54 < local_5c) {
    local_a0 = uVar23;
  }
  uVar16 = local_58;
  if (local_54 < local_58) {
    uVar16 = uVar23;
  }
  ms->lazySkipping = 0;
  local_88 = (ulong *)((long)src + (srcSize - 0x10));
  uVar13 = ms->nextToUpdate;
  uVar20 = (ulong)uVar13;
  uVar15 = ((int)local_88 - (int)(local_90 + uVar20)) + 1;
  uVar19 = 8;
  if (uVar15 < 8) {
    uVar19 = uVar15;
  }
  if (local_88 < local_90 + uVar20) {
    uVar19 = uVar23;
  }
  bVar11 = (byte)local_bc;
  local_b4 = uVar12;
  local_b0 = ms;
  local_98 = seqStore;
  local_48 = rep;
  if (uVar13 < uVar19 + uVar13) {
    local_b8 = uVar16;
    if (0x20 < ms->rowHashLog + 8) {
LAB_001e3df1:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar30 = ms->tagTable;
    uVar21 = ms->hashSalt;
    cVar6 = (char)ms->rowHashLog;
    do {
      if (uVar12 == 5) {
        uVar26 = *(long *)(local_90 + uVar20) * -0x30e4432345000000;
LAB_001e3132:
        uVar26 = (uVar26 ^ uVar21) >> (0x38U - cVar6 & 0x3f);
      }
      else {
        if (uVar12 == 6) {
          uVar26 = *(long *)(local_90 + uVar20) * -0x30e4432340650000;
          goto LAB_001e3132;
        }
        uVar26 = (ulong)((*(int *)(local_90 + uVar20) * -0x61c8864f ^ (uint)uVar21) >>
                        (0x18U - cVar6 & 0x1f));
      }
      uVar23 = ((uint)(uVar26 >> 8) & 0xffffff) << (bVar11 & 0x1f);
      if (((ulong)(pUVar3 + uVar23) & 0x3f) != 0) {
LAB_001e3cf9:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar30 + uVar23) & ~(-1L << (bVar11 & 0x3f))) != 0) {
LAB_001e3cda:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar20 & 7] = (U32)uVar26;
      uVar20 = uVar20 + 1;
    } while (uVar19 + uVar13 != uVar20);
  }
  iLimit = (ulong *)(srcSize + (long)src);
  if (puVar28 < local_88) {
    puVar10 = (ulong *)((long)iLimit + -7);
    local_70 = (ulong *)((long)iLimit + -3);
    local_78 = (ulong *)((long)iLimit + -1);
    local_50 = iLimit + -4;
    local_38 = ~(-1L << (bVar11 & 0x3f));
    local_80 = puVar10;
    do {
      local_68 = -(ulong)uVar16;
      if (uVar16 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (*(int *)(((long)puVar28 + 1) - (ulong)uVar16) == *(int *)((long)puVar28 + 1)) {
          puVar27 = (ulong *)((long)puVar28 + 5);
          puVar14 = (ulong *)((long)puVar28 + local_68 + 5);
          puVar29 = puVar27;
          if (puVar27 < puVar10) {
            uVar21 = *puVar27 ^ *puVar14;
            uVar20 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = uVar20 >> 3 & 0x1fffffff;
            if (*puVar14 == *puVar27) {
              puVar29 = (ulong *)((long)puVar28 + 0xd);
              puVar14 = (ulong *)((long)puVar28 + local_68 + 0xd);
              do {
                if (puVar10 <= puVar29) goto LAB_001e32ca;
                uVar21 = *puVar14;
                uVar26 = *puVar29;
                uVar22 = uVar26 ^ uVar21;
                uVar20 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                uVar20 = (long)puVar29 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar27);
                puVar29 = puVar29 + 1;
                puVar14 = puVar14 + 1;
              } while (uVar21 == uVar26);
            }
          }
          else {
LAB_001e32ca:
            if ((puVar29 < local_70) && ((int)*puVar14 == (int)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar29 < local_78) && ((short)*puVar14 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar29 < iLimit) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar14 == (char)*puVar29));
            }
            uVar20 = (long)puVar29 - (long)puVar27;
          }
          uVar20 = uVar20 + 4;
        }
      }
      local_c8 = 999999999;
      local_b8 = uVar16;
      if (uVar12 == 6) {
        if (local_bc == 6) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
        }
        else if (local_bc == 5) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
        }
        else {
          uVar21 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
        }
      }
      else if (uVar12 == 5) {
        if (local_bc == 6) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
        }
        else if (local_bc == 5) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
        }
        else {
          uVar21 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
        }
      }
      else if (local_bc == 6) {
        uVar21 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
      }
      else if (local_bc == 5) {
        uVar21 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
      }
      else {
        uVar21 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar28,(BYTE *)iLimit,&local_c8);
      }
      local_a8 = uVar20;
      if (uVar20 < uVar21) {
        local_a8 = uVar21;
      }
      if (local_a8 < 4) {
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar28 - (long)src));
        puVar10 = local_80;
        puVar28 = (ulong *)((long)puVar28 + ((ulong)((long)puVar28 - (long)src) >> 8) + 1);
        uVar16 = local_b8;
        uVar13 = local_a0;
      }
      else {
        puVar10 = puVar28;
        uVar26 = local_c8;
        if (uVar21 <= uVar20) {
          puVar10 = (ulong *)((long)puVar28 + 1);
          uVar26 = 1;
        }
        puVar27 = (ulong *)((long)puVar28 + local_68 + 0xd);
        do {
          if (local_88 <= puVar28) break;
          puVar29 = (ulong *)((long)puVar28 + 1);
          if (((uVar26 != 0) && (local_b8 != 0)) &&
             (*(int *)puVar29 == *(int *)((long)puVar29 + local_68))) {
            puVar14 = (ulong *)((long)puVar28 + 5);
            puVar17 = (ulong *)((long)puVar28 + local_68 + 5);
            puVar9 = puVar14;
            if (puVar14 < local_80) {
              uVar21 = *puVar14 ^ *puVar17;
              uVar20 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar20 = uVar20 >> 3 & 0x1fffffff;
              if (*puVar17 == *puVar14) {
                puVar9 = (ulong *)((long)puVar28 + 0xd);
                puVar17 = puVar27;
                do {
                  if (local_80 <= puVar9) goto LAB_001e34fd;
                  uVar21 = *puVar17;
                  uVar22 = *puVar9;
                  uVar24 = uVar22 ^ uVar21;
                  uVar20 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = (long)puVar9 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar14);
                  puVar9 = puVar9 + 1;
                  puVar17 = puVar17 + 1;
                } while (uVar21 == uVar22);
              }
            }
            else {
LAB_001e34fd:
              if ((puVar9 < local_70) && ((int)*puVar17 == (int)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 4);
                puVar17 = (ulong *)((long)puVar17 + 4);
              }
              if ((puVar9 < local_78) && ((short)*puVar17 == (short)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 2);
                puVar17 = (ulong *)((long)puVar17 + 2);
              }
              if (puVar9 < iLimit) {
                puVar9 = (ulong *)((long)puVar9 + (ulong)((char)*puVar17 == (char)*puVar9));
              }
              uVar20 = (long)puVar9 - (long)puVar14;
            }
            uVar16 = (uint)uVar26;
            if (uVar16 == 0) goto LAB_001e3cbb;
            if (uVar20 < 0xfffffffffffffffc) {
              uVar23 = 0x1f;
              if (uVar16 != 0) {
                for (; uVar16 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                }
              }
              if ((int)((uVar23 ^ 0x1f) + (int)local_a8 * 3 + -0x1e) < (int)(uVar20 + 4) * 3) {
                uVar26 = 1;
                puVar10 = puVar29;
                local_a8 = uVar20 + 4;
              }
            }
          }
          local_c8 = 999999999;
          if (uVar12 == 6) {
            if (local_bc == 6) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_6_6
                                 (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
            }
            else if (local_bc == 5) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_6_5
                                 (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
            }
            else {
              uVar20 = ZSTD_RowFindBestMatch_noDict_6_4
                                 (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
            }
          }
          else if (uVar12 == 5) {
            if (local_bc == 6) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_5_6
                                 (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
            }
            else if (local_bc == 5) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_5_5
                                 (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
            }
            else {
              uVar20 = ZSTD_RowFindBestMatch_noDict_5_4
                                 (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
            }
          }
          else if (local_bc == 6) {
            uVar20 = ZSTD_RowFindBestMatch_noDict_4_6
                               (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
          }
          else if (local_bc == 5) {
            uVar20 = ZSTD_RowFindBestMatch_noDict_4_5
                               (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
          }
          else {
            uVar20 = ZSTD_RowFindBestMatch_noDict_4_4
                               (local_b0,(BYTE *)puVar29,(BYTE *)iLimit,&local_c8);
          }
          uVar16 = (uint)local_c8;
          if ((uVar16 == 0) || (uVar23 = (uint)uVar26, uVar23 == 0)) {
LAB_001e3cbb:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          bVar5 = true;
          if (3 < uVar20) {
            iVar25 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            uVar16 = 0x1f;
            if (uVar23 != 0) {
              for (; uVar23 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            if ((int)((uVar16 ^ 0x1f) + (int)local_a8 * 4 + -0x1b) < (int)uVar20 * 4 - iVar25) {
              bVar5 = false;
              uVar26 = local_c8;
              puVar10 = puVar29;
              local_a8 = uVar20;
            }
          }
          puVar27 = (ulong *)((long)puVar27 + 1);
          puVar28 = puVar29;
        } while (!bVar5);
        uVar20 = local_a8;
        uVar13 = local_a0;
        uVar23 = local_b8;
        if (3 < uVar26) {
          if ((src < puVar10) && (local_40 < (BYTE *)((long)puVar10 + (3 - uVar26)))) {
            puVar28 = puVar10;
            while (puVar10 = puVar28,
                  *(char *)((long)puVar28 - 1) == *(char *)((long)puVar28 + (2 - uVar26))) {
              puVar10 = (ulong *)((long)puVar28 - 1);
              uVar20 = uVar20 + 1;
              if ((puVar10 <= src) ||
                 (pBVar30 = (BYTE *)((long)puVar28 + (2 - uVar26)), puVar28 = puVar10,
                 pBVar30 <= local_40)) break;
            }
          }
          uVar13 = local_b8;
          uVar23 = (U32)uVar26 - 3;
        }
        if (local_98->maxNbSeq <=
            (ulong)((long)local_98->sequences - (long)local_98->sequencesStart >> 3)) {
LAB_001e3d75:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_a8 = uVar20;
        if (0x20000 < local_98->maxNbLit) {
LAB_001e3d94:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar20 = (long)puVar10 - (long)src;
        puVar28 = (ulong *)local_98->lit;
        if (local_98->litStart + local_98->maxNbLit < (BYTE *)((long)puVar28 + uVar20)) {
LAB_001e3d37:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < puVar10) {
LAB_001e3d18:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar10) {
          ZSTD_safecopyLiterals((BYTE *)puVar28,(BYTE *)src,(BYTE *)puVar10,(BYTE *)local_50);
        }
        else {
          uVar21 = *(ulong *)((long)src + 8);
          *puVar28 = *src;
          puVar28[1] = uVar21;
          if (0x10 < uVar20) {
            pBVar30 = local_98->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar30 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar21 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar30 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar30 + 0x18) = uVar21;
            if (0x20 < (long)uVar20) {
              lVar18 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar18 + 0x20);
                uVar7 = puVar2[1];
                pBVar1 = pBVar30 + lVar18 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar7;
                puVar2 = (undefined8 *)((long)src + lVar18 + 0x30);
                uVar7 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar7;
                lVar18 = lVar18 + 0x20;
              } while (pBVar1 + 0x20 < pBVar30 + uVar20);
            }
          }
        }
        ms = local_b0;
        local_98->lit = local_98->lit + uVar20;
        if (0xffff < uVar20) {
          if (local_98->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_98->longLengthType = ZSTD_llt_literalLength;
          local_98->longLengthPos =
               (U32)((ulong)((long)local_98->sequences - (long)local_98->sequencesStart) >> 3);
        }
        psVar4 = local_98->sequences;
        psVar4->litLength = (U16)uVar20;
        psVar4->offBase = (U32)uVar26;
        if (local_a8 < 3) {
LAB_001e3d56:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_a8 - 3) {
          if (local_98->longLengthType != ZSTD_llt_none) {
LAB_001e3db3:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_98->longLengthType = ZSTD_llt_matchLength;
          local_98->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_98->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(local_a8 - 3);
        local_98->sequences = psVar4 + 1;
        if (local_b0->lazySkipping != 0) {
          uVar16 = local_b0->nextToUpdate;
          uVar20 = (ulong)uVar16;
          uVar12 = ((int)local_88 - (int)(local_90 + uVar20)) + 1;
          if (7 < uVar12) {
            uVar12 = 8;
          }
          if (local_88 < local_90 + uVar20) {
            uVar12 = 0;
          }
          if (uVar16 < uVar12 + uVar16) {
            if (0x20 < local_b0->rowHashLog + 8) goto LAB_001e3df1;
            pUVar3 = local_b0->hashTable;
            pBVar30 = local_b0->tagTable;
            uVar21 = local_b0->hashSalt;
            cVar6 = (char)local_b0->rowHashLog;
            do {
              if (local_b4 == 5) {
                uVar26 = *(long *)(local_90 + uVar20) * -0x30e4432345000000;
LAB_001e39a7:
                uVar26 = (uVar26 ^ uVar21) >> (0x38U - cVar6 & 0x3f);
              }
              else {
                if (local_b4 == 6) {
                  uVar26 = *(long *)(local_90 + uVar20) * -0x30e4432340650000;
                  goto LAB_001e39a7;
                }
                uVar26 = (ulong)((*(int *)(local_90 + uVar20) * -0x61c8864f ^ (uint)uVar21) >>
                                (0x18U - cVar6 & 0x1f));
              }
              uVar19 = ((uint)(uVar26 >> 8) & 0xffffff) << ((byte)local_bc & 0x1f);
              if (((ulong)(pUVar3 + uVar19) & 0x3f) != 0) goto LAB_001e3cf9;
              if ((local_38 & (ulong)(pBVar30 + uVar19)) != 0) goto LAB_001e3cda;
              local_b0->hashCache[(uint)uVar20 & 7] = (U32)uVar26;
              uVar20 = uVar20 + 1;
            } while (uVar12 + uVar16 != uVar20);
          }
          local_b0->lazySkipping = 0;
        }
        src = (void *)((long)puVar10 + local_a8);
        puVar10 = local_80;
        puVar28 = (ulong *)src;
        uVar12 = local_b4;
        uVar16 = uVar23;
        if ((uVar13 != 0) && (src <= local_88)) {
          while (uVar19 = uVar13, psVar8 = local_98, uVar20 = (ulong)uVar19, puVar28 = (ulong *)src,
                uVar12 = local_b4, uVar16 = uVar23, uVar13 = uVar19,
                (int)*src == *(int *)((long)src - uVar20)) {
            puVar28 = (ulong *)((long)src + 4);
            puVar29 = (ulong *)((long)src + (4 - uVar20));
            puVar27 = puVar28;
            if (puVar28 < puVar10) {
              uVar26 = *puVar28 ^ *puVar29;
              uVar21 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
              if (*puVar29 == *puVar28) {
                puVar27 = (ulong *)((long)src + 0xc);
                puVar29 = (ulong *)((long)src + (0xc - uVar20));
                do {
                  if (puVar10 <= puVar27) goto LAB_001e3afa;
                  uVar20 = *puVar29;
                  uVar26 = *puVar27;
                  uVar22 = uVar26 ^ uVar20;
                  uVar21 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = (long)puVar27 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar28);
                  puVar27 = puVar27 + 1;
                  puVar29 = puVar29 + 1;
                } while (uVar20 == uVar26);
              }
            }
            else {
LAB_001e3afa:
              if ((puVar27 < local_70) && ((int)*puVar29 == (int)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar27 < local_78) && ((short)*puVar29 == (short)*puVar27)) {
                puVar27 = (ulong *)((long)puVar27 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar27 < iLimit) {
                puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar29 == (char)*puVar27));
              }
              uVar21 = (long)puVar27 - (long)puVar28;
            }
            if (local_98->maxNbSeq <=
                (ulong)((long)local_98->sequences - (long)local_98->sequencesStart >> 3))
            goto LAB_001e3d75;
            if (0x20000 < local_98->maxNbLit) goto LAB_001e3d94;
            puVar28 = (ulong *)local_98->lit;
            if (local_98->litStart + local_98->maxNbLit < puVar28) goto LAB_001e3d37;
            if (iLimit < src) goto LAB_001e3d18;
            if (local_50 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar28,(BYTE *)src,(BYTE *)src,(BYTE *)local_50);
              puVar10 = local_80;
            }
            else {
              uVar20 = *(ulong *)((long)src + 8);
              *puVar28 = *src;
              puVar28[1] = uVar20;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (uVar21 + 4 < 3) goto LAB_001e3d56;
            if (0xffff < uVar21 + 1) {
              if (psVar8->longLengthType != ZSTD_llt_none) goto LAB_001e3db3;
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(uVar21 + 1);
            psVar8->sequences = psVar4 + 1;
            src = (void *)((long)src + uVar21 + 4);
            puVar28 = (ulong *)src;
            uVar12 = local_b4;
            uVar16 = uVar19;
            uVar13 = uVar23;
            if ((uVar23 == 0) || (uVar23 = uVar19, local_88 < src)) break;
          }
        }
      }
      local_a0 = uVar13;
    } while (puVar28 < local_88);
  }
  if (local_5c <= local_54) {
    local_5c = 0;
  }
  uVar12 = local_5c;
  if (uVar16 != 0) {
    uVar12 = local_58;
  }
  if (local_58 <= local_54) {
    uVar12 = local_5c;
    local_58 = 0;
  }
  if (uVar16 != 0) {
    local_58 = uVar16;
  }
  if (local_a0 != 0) {
    uVar12 = local_a0;
  }
  *local_48 = local_58;
  local_48[1] = uVar12;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}